

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::OneofDescriptorProto::_InternalSerialize
          (OneofDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  OneofOptions *value;
  string_view s;
  OneofDescriptorProto *this_00;
  bool bVar1;
  int iVar2;
  uint32_t *puVar3;
  char *data;
  UnknownFieldSet *unknown_fields;
  string_view local_48;
  string *local_38;
  string *_s;
  OneofDescriptorProto *pOStack_28;
  uint32_t cached_has_bits;
  OneofDescriptorProto *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  OneofDescriptorProto *this_local;
  
  _s._4_4_ = 0;
  pOStack_28 = this;
  this_ = (OneofDescriptorProto *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar3;
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_name_abi_cxx11_(pOStack_28);
    data = (char *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"google.protobuf.OneofDescriptorProto.name");
    internal::WireFormat::VerifyUTF8StringNamedField(data,iVar2,SERIALIZE,local_48);
    this_00 = this_;
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)this_00,1,s,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    value = (pOStack_28->field_0)._impl_.options_;
    iVar2 = OneofOptions::GetCachedSize((pOStack_28->field_0)._impl_.options_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)value,iVar2,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(pOStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pOStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL OneofDescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const OneofDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.OneofDescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.OneofDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional .google.protobuf.OneofOptions options = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.OneofDescriptorProto)
  return target;
}